

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::EntrySeal(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  GlobalObject *this;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var instance;
  GlobalObject *aValue;
  GlobalObject *pGVar6;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x360,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00ce183e;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_38 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x363,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00ce183e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (((ulong)local_38 & 0xfffffe) == 0) {
    aValue = (GlobalObject *)
             (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    instance = Arguments::operator[]((Arguments *)local_38,1);
    BVar4 = JavascriptOperators::IsObject(instance);
    aValue = (GlobalObject *)Arguments::operator[]((Arguments *)local_38,1);
    if (BVar4 != 0) {
      aValue = (GlobalObject *)VarTo<Js::RecyclableObject>(aValue);
      this = (((((aValue->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.ptr)
               ->javascriptLibrary).ptr)->super_JavascriptLibraryBase).globalObject.ptr;
      if (this != (GlobalObject *)0x0 && this != aValue) {
        pGVar6 = (GlobalObject *)GlobalObject::ToThis(this);
        if (pGVar6 == aValue) {
          (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x37])
                    (this);
        }
      }
      (*(aValue->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x37])
                (aValue);
    }
  }
  return aValue;
}

Assistant:

Var JavascriptObject::EntrySeal(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Object_Constructor_seal);

    // Spec update in Rev29 under section 19.1.2.17
    if (args.Info.Count < 2)
    {
        return scriptContext->GetLibrary()->GetUndefined();
    }
    else if (!JavascriptOperators::IsObject(args[1]))
    {
        return args[1];
    }


    RecyclableObject *object = VarTo<RecyclableObject>(args[1]);

    GlobalObject* globalObject = object->GetLibrary()->GetGlobalObject();
    if (globalObject != object && globalObject && (globalObject->ToThis() == object))
    {
        globalObject->Seal();
    }

    object->Seal();
    return object;
}